

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O3

void __thiscall libtorrent::aux::session_impl::abort(session_impl *this)

{
  _Rb_tree_header *p_Var1;
  counters *this_00;
  handler_storage<72UL,_(libtorrent::aux::HandlerName)4> *op;
  _Base_ptr p_Var2;
  pointer psVar3;
  service_type *psVar4;
  ip_change_notifier *piVar5;
  pointer psVar6;
  long *plVar7;
  pointer psVar8;
  element_type *this_01;
  io_context *piVar9;
  handler_storage<72UL,_(libtorrent::aux::HandlerName)4> *phVar10;
  io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  *piVar11;
  __visit_result_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_include_libtorrent_aux__polymorphic_socket_hpp:53:5),_const_std::variant<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>_&>
  _Var12;
  _Base_ptr p_Var13;
  _Rb_tree_node_base *p_Var14;
  element_type *peVar15;
  type *__range2;
  type alloc;
  implementation_type *piVar16;
  shared_ptr<libtorrent::plugin> *ext;
  pointer psVar17;
  pointer psVar18;
  iterator __begin2;
  pointer psVar19;
  error_code ec;
  undefined1 local_78 [16];
  _Base_ptr local_68;
  _Base_ptr p_Stack_60;
  _Base_ptr local_58;
  size_t local_50;
  error_code local_40;
  anon_class_8_1_3fcf655c local_30;
  
  if (this->m_abort == false) {
    session_log(this," *** ABORT CALLED ***");
    local_68 = (_Base_ptr)0x0;
    p_Stack_60 = (_Base_ptr)0x0;
    local_78 = ZEXT816(0);
    alert_manager::set_notify_function(&this->m_alerts,(function<void_()> *)local_78);
    if (local_68 != (_Base_ptr)0x0) {
      (*(code *)local_68)(local_78,local_78,3);
    }
    psVar3 = (this->m_ses_extensions)._M_elems[0].
             super__Vector_base<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar17 = (this->m_ses_extensions)._M_elems[0].
                   super__Vector_base<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; psVar17 != psVar3;
        psVar17 = psVar17 + 1) {
      (*((psVar17->super___shared_ptr<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
        _vptr_plugin[5])();
    }
    resolver::abort(&this->m_host_resolver);
    if ((this->m_close_file_timer).impl_.implementation_.might_have_pending_waits == true) {
      psVar4 = (this->m_close_file_timer).impl_.service_;
      boost::asio::detail::epoll_reactor::
      cancel_timer<boost::asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>>>
                (psVar4->scheduler_,&psVar4->timer_queue_,
                 &(this->m_close_file_timer).impl_.implementation_.timer_data,0xffffffffffffffff);
      (this->m_close_file_timer).impl_.implementation_.might_have_pending_waits = false;
    }
    this->m_abort = true;
    local_40.val_ = 0;
    local_40.failed_ = false;
    local_40.cat_ =
         &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
    if ((this->m_timer).impl_.implementation_.might_have_pending_waits == true) {
      psVar4 = (this->m_timer).impl_.service_;
      boost::asio::detail::epoll_reactor::
      cancel_timer<boost::asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>>>
                (psVar4->scheduler_,&psVar4->timer_queue_,
                 &(this->m_timer).impl_.implementation_.timer_data,0xffffffffffffffff);
      (this->m_timer).impl_.implementation_.might_have_pending_waits = false;
    }
    i2p_connection::close(&this->m_i2p_conn,(int)&local_40);
    piVar5 = (this->m_ip_notifier)._M_t.
             super___uniq_ptr_impl<libtorrent::aux::ip_change_notifier,_std::default_delete<libtorrent::aux::ip_change_notifier>_>
             ._M_t.
             super__Tuple_impl<0UL,_libtorrent::aux::ip_change_notifier_*,_std::default_delete<libtorrent::aux::ip_change_notifier>_>
             .super__Head_base<0UL,_libtorrent::aux::ip_change_notifier_*,_false>._M_head_impl;
    if (piVar5 != (ip_change_notifier *)0x0) {
      (*piVar5->_vptr_ip_change_notifier[1])();
      piVar5 = (this->m_ip_notifier)._M_t.
               super___uniq_ptr_impl<libtorrent::aux::ip_change_notifier,_std::default_delete<libtorrent::aux::ip_change_notifier>_>
               ._M_t.
               super__Tuple_impl<0UL,_libtorrent::aux::ip_change_notifier_*,_std::default_delete<libtorrent::aux::ip_change_notifier>_>
               .super__Head_base<0UL,_libtorrent::aux::ip_change_notifier_*,_false>._M_head_impl;
      (this->m_ip_notifier)._M_t.
      super___uniq_ptr_impl<libtorrent::aux::ip_change_notifier,_std::default_delete<libtorrent::aux::ip_change_notifier>_>
      ._M_t.
      super__Tuple_impl<0UL,_libtorrent::aux::ip_change_notifier_*,_std::default_delete<libtorrent::aux::ip_change_notifier>_>
      .super__Head_base<0UL,_libtorrent::aux::ip_change_notifier_*,_false>._M_head_impl =
           (ip_change_notifier *)0x0;
      if (piVar5 != (ip_change_notifier *)0x0) {
        (*piVar5->_vptr_ip_change_notifier[3])();
      }
    }
    stop_lsd(this);
    stop_upnp(this);
    stop_natpmp(this);
    stop_dht(this);
    if ((this->m_dht_announce_timer).impl_.implementation_.might_have_pending_waits == true) {
      psVar4 = (this->m_dht_announce_timer).impl_.service_;
      boost::asio::detail::epoll_reactor::
      cancel_timer<boost::asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>>>
                (psVar4->scheduler_,&psVar4->timer_queue_,
                 &(this->m_dht_announce_timer).impl_.implementation_.timer_data,0xffffffffffffffff);
      (this->m_dht_announce_timer).impl_.implementation_.might_have_pending_waits = false;
    }
    if ((this->m_lsd_announce_timer).impl_.implementation_.might_have_pending_waits == true) {
      psVar4 = (this->m_lsd_announce_timer).impl_.service_;
      boost::asio::detail::epoll_reactor::
      cancel_timer<boost::asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>>>
                (psVar4->scheduler_,&psVar4->timer_queue_,
                 &(this->m_lsd_announce_timer).impl_.implementation_.timer_data,0xffffffffffffffff);
      (this->m_lsd_announce_timer).impl_.implementation_.might_have_pending_waits = false;
    }
    p_Var2 = (_Base_ptr)(local_78 + 8);
    local_68 = (this->m_incoming_sockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (local_68 == (_Base_ptr)0x0) {
      local_68 = (_Base_ptr)0x0;
      local_50 = 0;
      local_78._8_4_ = 0;
      p_Stack_60 = p_Var2;
      local_58 = p_Var2;
    }
    else {
      p_Var1 = &(this->m_incoming_sockets)._M_t._M_impl.super__Rb_tree_header;
      local_78._8_4_ =
           (this->m_incoming_sockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
      p_Var13 = (this->m_incoming_sockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_58 = (this->m_incoming_sockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
      local_68->_M_parent = p_Var2;
      local_50 = (this->m_incoming_sockets)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      (this->m_incoming_sockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      (this->m_incoming_sockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &p_Var1->_M_header;
      (this->m_incoming_sockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           &p_Var1->_M_header;
      (this->m_incoming_sockets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      p_Stack_60 = p_Var13;
      if (p_Var13 != p_Var2) {
        do {
          local_30.ec = &local_40;
          ::std::
          visit<libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,libtorrent::socks5_stream,libtorrent::aux::http_stream,libtorrent::aux::utp_stream,libtorrent::i2p_stream,libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::___ssl_stream<libtorrent::aux::http_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>>&>
                    (&local_30,
                     *(variant<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
                       **)(p_Var13 + 1));
          p_Var13 = (_Base_ptr)::std::_Rb_tree_increment(p_Var13);
        } while (p_Var13 != p_Var2);
      }
    }
    ::std::_Rb_tree<$9529104f$>::~_Rb_tree((_Rb_tree<_9529104f_> *)local_78);
    if ((this->m_i2p_listen_socket).
        super__Optional_base<libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>,_true,_false,_false>
        .
        super__Optional_payload_base<libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>_>
        ._M_engaged != false) {
      _Var12 = ::std::
               visit<libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,libtorrent::socks5_stream,libtorrent::aux::http_stream,libtorrent::aux::utp_stream,libtorrent::i2p_stream,libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::___tream<libtorrent::aux::http_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>>const&>
                         ((anon_class_1_0_00000001 *)local_78,
                          (variant<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
                           *)&this->m_i2p_listen_socket);
      if (_Var12) {
        local_78._0_8_ = &local_40;
        ::std::
        visit<libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,libtorrent::socks5_stream,libtorrent::aux::http_stream,libtorrent::aux::utp_stream,libtorrent::i2p_stream,libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::___ssl_stream<libtorrent::aux::http_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>>&>
                  ((anon_class_8_1_3fcf655c *)local_78,
                   (variant<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
                    *)&this->m_i2p_listen_socket);
      }
    }
    session_log(this," aborting all torrents (%d)",
                (ulong)((long)(this->m_torrents).m_array.
                              super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_torrents).m_array.
                             super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4);
    psVar6 = (this->m_torrents).m_array.
             super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar18 = (this->m_torrents).m_array.
                   super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; psVar18 != psVar6;
        psVar18 = psVar18 + 1) {
      torrent::abort((psVar18->
                     super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr);
    }
    ::std::
    vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
    ::clear(&(this->m_torrents).m_array);
    ::std::
    _Hashtable<libtorrent::digest32<160L>,_std::pair<const_libtorrent::digest32<160L>,_libtorrent::aux::torrent_*>,_std::allocator<std::pair<const_libtorrent::digest32<160L>,_libtorrent::aux::torrent_*>_>,_std::__detail::_Select1st,_std::equal_to<libtorrent::digest32<160L>_>,_std::hash<libtorrent::digest32<160L>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::clear(&(this->m_torrents).m_index._M_h);
    ::std::
    _Hashtable<libtorrent::digest32<160L>,_std::pair<const_libtorrent::digest32<160L>,_libtorrent::aux::torrent_*>,_std::allocator<std::pair<const_libtorrent::digest32<160L>,_libtorrent::aux::torrent_*>_>,_std::__detail::_Select1st,_std::equal_to<libtorrent::digest32<160L>_>,_std::hash<libtorrent::digest32<160L>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::clear(&(this->m_torrents).m_obfuscated_index._M_h);
    this_00 = &this->m_stats_counters;
    counters::set_value(this_00,0xe9,0);
    counters::set_value(this_00,0xeb,0);
    counters::set_value(this_00,0xea,0);
    session_log(this," aborting all tracker requests");
    tracker_manager::stop(&this->m_tracker_manager);
    session_log(this," aborting all connections (%d)",
                (ulong)(uint)(this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_node_count)
    ;
    p_Var14 = (this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while ((_Rb_tree_header *)p_Var14 != &(this->m_connections)._M_t._M_impl.super__Rb_tree_header)
    {
      plVar7 = *(long **)(p_Var14 + 1);
      p_Var14 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var14);
      local_78 = (undefined1  [16])errors::make_error_code(stopping_torrent);
      (**(code **)(*plVar7 + 0xa0))(plVar7,local_78,1,0);
    }
    psVar8 = (this->m_listen_sockets).
             super__Vector_base<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar19 = (this->m_listen_sockets).
                   super__Vector_base<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; psVar19 != psVar8;
        psVar19 = psVar19 + 1) {
      peVar15 = (psVar19->
                super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr;
      piVar16 = (implementation_type *)
                (peVar15->sock).
                super___shared_ptr<boost::asio::basic_socket_acceptor<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      if (piVar16 != (implementation_type *)0x0) {
        piVar11 = (io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                   *)&piVar16->super_base_implementation_type;
        piVar16 = &((io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                     *)&piVar16->super_base_implementation_type)->implementation_;
        boost::asio::detail::reactive_socket_service_base::close
                  (&piVar11->service_->super_reactive_socket_service_base,(int)piVar16);
        peVar15 = (psVar19->
                  super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr;
      }
      this_01 = (peVar15->udp_sock).
                super___shared_ptr<libtorrent::aux::session_udp_socket,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      if (this_01 != (element_type *)0x0) {
        udp_socket::close(&this_01->sock,(int)piVar16);
      }
    }
    if ((this->m_undead_peers).
        super__Vector_base<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->m_undead_peers).
        super__Vector_base<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      piVar9 = this->m_io_context;
      op = &this->m_abort_handler_storage;
      (this->m_abort_handler_storage).bytes._M_elems[0] = '\0';
      (this->m_abort_handler_storage).bytes._M_elems[1] = '\0';
      (this->m_abort_handler_storage).bytes._M_elems[2] = '\0';
      (this->m_abort_handler_storage).bytes._M_elems[3] = '\0';
      (this->m_abort_handler_storage).bytes._M_elems[4] = '\0';
      (this->m_abort_handler_storage).bytes._M_elems[5] = '\0';
      (this->m_abort_handler_storage).bytes._M_elems[6] = '\0';
      (this->m_abort_handler_storage).bytes._M_elems[7] = '\0';
      *(code **)((this->m_abort_handler_storage).bytes._M_elems + 8) =
           boost::asio::detail::
           executor_op<libtorrent::aux::allocating_handler<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/session_impl.cpp:1119:36),_72UL,_(libtorrent::aux::HandlerName)4>,_libtorrent::aux::handler_allocator<int,_72UL,_(libtorrent::aux::HandlerName)4>,_boost::asio::detail::scheduler_operation>
           ::do_complete;
      phVar10 = &this->m_abort_handler_storage;
      (phVar10->bytes)._M_elems[0x10] = '\0';
      (phVar10->bytes)._M_elems[0x11] = '\0';
      (phVar10->bytes)._M_elems[0x12] = '\0';
      (phVar10->bytes)._M_elems[0x13] = '\0';
      *(session_impl **)((this->m_abort_handler_storage).bytes._M_elems + 0x18) = this;
      *(handler_storage<72UL,_(libtorrent::aux::HandlerName)4> **)
       ((this->m_abort_handler_storage).bytes._M_elems + 0x20) = op;
      *(error_handler_interface **)((this->m_abort_handler_storage).bytes._M_elems + 0x28) =
           &this->super_error_handler_interface;
      *(handler_storage<72UL,_(libtorrent::aux::HandlerName)4> **)
       ((this->m_abort_handler_storage).bytes._M_elems + 0x30) = op;
      boost::asio::detail::scheduler::post_immediate_completion(piVar9->impl_,(operation *)op,false)
      ;
    }
  }
  return;
}

Assistant:

void session_impl::abort() noexcept
	{
		TORRENT_ASSERT(is_single_thread());

		if (m_abort) return;
#ifndef TORRENT_DISABLE_LOGGING
		session_log(" *** ABORT CALLED ***");
#endif

		// at this point we cannot call the notify function anymore, since the
		// session will become invalid.
		m_alerts.set_notify_function({});

#ifndef TORRENT_DISABLE_EXTENSIONS
		for (auto& ext : m_ses_extensions[plugins_all_idx])
		{
			ext->abort();
		}
#endif

		// this will cancel requests that are not critical for shutting down
		// cleanly. i.e. essentially tracker hostname lookups that we're not
		// about to send event=stopped to
		m_host_resolver.abort();

		m_close_file_timer.cancel();

		// abort the main thread
		m_abort = true;
		error_code ec;

		// we rely on on_tick() during shutdown, but we don't need to wait a
		// whole second for it to fire
		m_timer.cancel();

#if TORRENT_USE_I2P
		m_i2p_conn.close(ec);
#endif
		stop_ip_notifier();
		stop_lsd();
		stop_upnp();
		stop_natpmp();
#ifndef TORRENT_DISABLE_DHT
		stop_dht();
		m_dht_announce_timer.cancel();
#endif
		m_lsd_announce_timer.cancel();

#ifdef TORRENT_SSL_PEERS
		{
			auto const sockets = std::move(m_incoming_sockets);
			for (auto const& s : sockets)
			{
				s->close(ec);
				TORRENT_ASSERT(!ec);
			}
		}
#endif

#if TORRENT_USE_I2P
		if (m_i2p_listen_socket && m_i2p_listen_socket->is_open())
		{
			m_i2p_listen_socket->close(ec);
			TORRENT_ASSERT(!ec);
		}
#endif

#ifndef TORRENT_DISABLE_LOGGING
		session_log(" aborting all torrents (%d)", int(m_torrents.size()));
#endif
		// abort all torrents
		for (auto const& te : m_torrents)
		{
			te->abort();
		}
		m_torrents.clear();
		m_stats_counters.set_value(counters::num_peers_up_unchoked_all, 0);
		m_stats_counters.set_value(counters::num_peers_up_unchoked, 0);
		m_stats_counters.set_value(counters::num_peers_up_unchoked_optimistic, 0);

#ifndef TORRENT_DISABLE_LOGGING
		session_log(" aborting all tracker requests");
#endif
		m_tracker_manager.stop();

#ifndef TORRENT_DISABLE_LOGGING
		session_log(" aborting all connections (%d)", int(m_connections.size()));
#endif
		// abort all connections
		for (auto i = m_connections.begin(); i != m_connections.end();)
		{
			peer_connection* p = (*i).get();
			++i;
			p->disconnect(errors::stopping_torrent, operation_t::bittorrent);
		}

		// close the listen sockets
		for (auto const& l : m_listen_sockets)
		{
			if (l->sock)
			{
				l->sock->close(ec);
				TORRENT_ASSERT(!ec);
			}

			// TODO: 3 closing the udp sockets here means that
			// the uTP connections cannot be closed gracefully
			if (l->udp_sock)
			{
				l->udp_sock->sock.close();
			}
		}

		// we need to give all the sockets an opportunity to actually have their handlers
		// called and cancelled before we continue the shutdown. This is a bit
		// complicated, if there are no "undead" peers, it's safe to resume the
		// shutdown, but if there are, we have to wait for them to be cleared out
		// first. In session_impl::on_tick() we check them periodically. If we're
		// shutting down and we remove the last one, we'll initiate
		// shutdown_stage2 from there.
		if (m_undead_peers.empty())
		{
			post(m_io_context, make_handler([this] { abort_stage2(); }
				, m_abort_handler_storage, *this));
		}
	}